

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O2

void __thiscall
Finger::Finger(Finger *this,Vec4i *defect,
              vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt,Rect *boundingBox,
              int maxAngle,bool shouldCheckAngles,bool shouldCheckDist,int index)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec4i VStack_48;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_38;
  
  (this->ptStart).x = 0;
  (this->ptStart).y = 0;
  (this->ptEnd).x = 0;
  (this->ptEnd).y = 0;
  (this->ptFar).x = 0;
  (this->ptFar).y = 0;
  this->minDepth = 0xb;
  this->ok = false;
  this->shouldCheckAngles = shouldCheckAngles;
  this->shouldCheckDist = shouldCheckDist;
  this->index = index;
  this->hndAngle = -1;
  iVar1 = boundingBox->y;
  iVar2 = boundingBox->width;
  iVar3 = boundingBox->height;
  (this->boundingBox).x = boundingBox->x;
  (this->boundingBox).y = iVar1;
  (this->boundingBox).width = iVar2;
  (this->boundingBox).height = iVar3;
  this->depth = (float)((defect->super_Matx<int,_4,_1>).val[3] / 0x100);
  this->maxAngle = (float)maxAngle;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_38,cnt);
  cv::Matx<int,_4,_1>::Matx(&VStack_48.super_Matx<int,_4,_1>,(int *)defect);
  getPoints(this,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_38,&VStack_48)
  ;
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base(&local_38);
  check(this);
  return;
}

Assistant:

Finger::Finger(const Vec4i &defect, const vector<Point> &cnt, const Rect &boundingBox, int maxAngle,
               bool shouldCheckAngles, bool shouldCheckDist, int index)
        : boundingBox(boundingBox), maxAngle(maxAngle), shouldCheckAngles(shouldCheckAngles),
          shouldCheckDist(shouldCheckDist), index(index) {
    depth = defect[3] / 256;
    getPoints(cnt, defect);
    check();
}